

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O1

_Bool history_is_artifact_known(player *p,artifact *artifact)

{
  _Bool _Var1;
  size_t sVar2;
  long lVar3;
  _Bool _Var4;
  
  if (artifact == (artifact *)0x0) {
    __assert_fail("artifact",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-history.c"
                  ,0x90,"_Bool history_is_artifact_known(struct player *, const struct artifact *)")
    ;
  }
  sVar2 = (p->hist).next;
  _Var4 = sVar2 != 0;
  if (_Var4) {
    lVar3 = sVar2 * 0x5c;
    do {
      _Var1 = flag_has_dbg((p->hist).entries[-1].type + lVar3,2,3,"h->entries[i].type",
                           "HIST_ARTIFACT_KNOWN");
      if ((_Var1) && (artifact->aidx == (uint)(p->hist).entries[-1].type[lVar3 + 6])) {
        return _Var4;
      }
      sVar2 = sVar2 - 1;
      _Var4 = sVar2 != 0;
      lVar3 = lVar3 + -0x5c;
    } while (_Var4);
  }
  return _Var4;
}

Assistant:

bool history_is_artifact_known(struct player *p, const struct artifact *artifact)
{
	struct player_history *h = &p->hist;

	size_t i = h->next;
	assert(artifact);

	while (i--) {
		if (hist_has(h->entries[i].type, HIST_ARTIFACT_KNOWN) &&
				h->entries[i].a_idx == artifact->aidx)
			return true;
	}

	return false;
}